

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::abort(FastText *this)

{
  AbortError *this_00;
  
  this_00 = (AbortError *)__cxa_allocate_exception(0x10);
  AbortError::AbortError(this_00);
  __cxa_throw(this_00,&AbortError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FastText::abort() {
  try {
    throw AbortError();
  } catch (AbortError&) {
    trainException_ = std::current_exception();
  }
}